

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adt_ary.c
# Opt level: O0

void ** adt_ary_get(adt_ary_t *self,int32_t s32Index)

{
  int local_1c;
  int32_t s32Index_local;
  adt_ary_t *self_local;
  
  if (self == (adt_ary_t *)0x0) {
    self_local = (adt_ary_t *)0x0;
  }
  else {
    local_1c = s32Index;
    if (s32Index < 0) {
      if (self->s32CurLen < -s32Index) {
        return (void **)0x0;
      }
      local_1c = self->s32CurLen + s32Index;
    }
    adt_ary_fill(self,local_1c + 1);
    self_local = (adt_ary_t *)(self->pFirst + local_1c);
  }
  return &self_local->ppAlloc;
}

Assistant:

void**	adt_ary_get(adt_ary_t *self, int32_t s32Index){
	if(self==0){
		return (void**)0;
	}
	if(s32Index<0){
		s32Index = (-s32Index);
		if(s32Index > (self->s32CurLen) ){
			//negative index outside array bounds
			return (void**) 0;
		}
		//negative index inside array bounds
		s32Index=self->s32CurLen-s32Index;
	}
	adt_ary_fill(self,(int32_t) (s32Index+1));
	return &self->pFirst[s32Index];
}